

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUIScrollBar::CGUIScrollBar
          (CGUIScrollBar *this,void **vtt,bool horizontal,IGUIEnvironment *environment,
          IGUIElement *parent,s32 id,rect<int> rectangle,bool noclip)

{
  rect<int> rectangle_00;
  undefined8 in_RCX;
  byte in_DL;
  IGUIEnvironment *in_RSI;
  IGUIElement *in_RDI;
  vector2d<int> in_R8;
  undefined4 in_R9D;
  IGUIElement *in_stack_00000008;
  IGUIElement *in_stack_00000010;
  undefined1 in_stack_00000018;
  CGUIScrollBar *in_stack_00000140;
  undefined1 noClip;
  IGUIElement *this_00;
  undefined3 in_stack_ffffffffffffffd0;
  
  rectangle_00.LowerRightCorner = in_R8;
  rectangle_00.UpperLeftCorner =
       (vector2d<int>)
       (CONCAT44(in_R9D,CONCAT13(in_stack_00000018,in_stack_ffffffffffffffd0)) & 0xffffffff01ffffff)
  ;
  this_00 = in_stack_00000008;
  IGUIScrollBar::IGUIScrollBar
            ((IGUIScrollBar *)in_stack_00000008,(void **)in_RDI,in_RSI,(IGUIElement *)in_RSI,
             (s32)((ulong)in_RCX >> 0x20),rectangle_00);
  noClip = (undefined1)((ulong)in_stack_00000008 >> 0x38);
  (in_RDI->super_IEventReceiver)._vptr_IEventReceiver = in_RSI->_vptr_IGUIEnvironment;
  *(undefined8 *)
   ((long)&(in_RDI->super_IEventReceiver)._vptr_IEventReceiver +
   (long)(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[-3]) =
       *(undefined8 *)&in_RSI[1].field_0x8;
  *(undefined8 *)&in_RDI->field_0x138 = 0;
  *(undefined8 *)&in_RDI->field_0x140 = 0;
  core::rect<int>::rect((rect<int> *)in_stack_00000010);
  *(undefined1 *)
   &in_RDI[1].Children.
    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
    _M_node.super__List_node_base._M_next = 0;
  *(byte *)((long)&in_RDI[1].Children.
                   super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                   ._M_impl._M_node.super__List_node_base._M_next + 1) = in_DL & 1;
  *(undefined1 *)
   ((long)&in_RDI[1].Children.
           super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
           _M_impl._M_node.super__List_node_base._M_next + 2) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].Children.
           super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
           _M_impl._M_node.super__List_node_base._M_next + 3) = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].Children.
           super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
           _M_impl._M_node.super__List_node_base._M_next + 4) = 0;
  *(undefined4 *)
   &in_RDI[1].Children.
    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
    _M_node.super__List_node_base._M_prev = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].Children.
           super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
           _M_impl._M_node.super__List_node_base._M_prev + 4) = 0;
  *(undefined4 *)
   &in_RDI[1].Children.
    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
    _M_node._M_size = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].Children.
           super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
           _M_impl._M_node._M_size + 4) = 100;
  *(undefined4 *)&in_RDI[1].Parent = 10;
  *(undefined4 *)((long)&in_RDI[1].Parent + 4) = 0x32;
  *(undefined4 *)&in_RDI[1].ParentPos._M_node = 0;
  *(undefined4 *)((long)&in_RDI[1].ParentPos._M_node + 4) = 0;
  video::SColor::SColor((SColor *)&in_RDI[1].RelativeRect);
  refreshControls(in_stack_00000140);
  IGUIElement::setNotClipped(in_stack_00000010,(bool)noClip);
  IGUIElement::setTabStop(in_RDI,true);
  IGUIElement::setTabOrder(this_00,(s32)((ulong)in_RDI >> 0x20));
  (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x2d])(in_RDI,0);
  return;
}

Assistant:

CGUIScrollBar::CGUIScrollBar(bool horizontal, IGUIEnvironment *environment,
		IGUIElement *parent, s32 id,
		core::rect<s32> rectangle, bool noclip) :
		IGUIScrollBar(environment, parent, id, rectangle),
		UpButton(0),
		DownButton(0), Dragging(false), Horizontal(horizontal),
		DraggedBySlider(false), TrayClick(false), Pos(0), DrawPos(0),
		DrawHeight(0), Min(0), Max(100), SmallStep(10), LargeStep(50), DesiredPos(0),
		LastChange(0)
{
#ifdef _DEBUG
	setDebugName("CGUIScrollBar");
#endif

	refreshControls();

	setNotClipped(noclip);

	// this element can be tabbed to
	setTabStop(true);
	setTabOrder(-1);

	setPos(0);
}